

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::DebugLocateItemResolveWithLastItem(void)

{
  ImGuiContext *pIVar1;
  float unaff_retaddr;
  ImDrawFlags unaff_retaddr_00;
  float in_stack_00000008;
  ImU32 in_stack_0000000c;
  ImVec2 *in_stack_00000010;
  ImVec2 p2;
  ImVec2 p1;
  ImRect r;
  ImDrawList *draw_list;
  ImGuiLastItemData item_data;
  ImGuiContext *g;
  float local_84;
  float local_80;
  float local_78;
  float local_74;
  ImVec2 local_70;
  ImVec2 local_68;
  ImRect local_60;
  ImDrawList *local_50;
  undefined1 local_44 [12];
  float in_stack_ffffffffffffffc8;
  float in_stack_ffffffffffffffcc;
  ImVec2 in_stack_ffffffffffffffd0;
  ImVec2 p2_00;
  ImVec2 *in_stack_ffffffffffffffd8;
  ImDrawList *in_stack_ffffffffffffffe0;
  
  pIVar1 = GImGui;
  memcpy(local_44,&GImGui->LastItemData,0x3c);
  pIVar1->DebugLocateId = 0;
  local_60.Max = in_stack_ffffffffffffffd0;
  local_50 = GetForegroundDrawList((ImGuiWindow *)0x4a8d8a);
  p2_00 = local_60.Max;
  local_60.Min.x = in_stack_ffffffffffffffc8;
  local_60.Min.y = in_stack_ffffffffffffffcc;
  ImRect::Expand(&local_60,3.0);
  local_68 = (pIVar1->IO).MousePos;
  if (local_60.Min.x <= local_68.x) {
    if (local_68.x <= local_60.Max.x) {
      local_78 = local_68.x;
    }
    else {
      local_78 = local_60.Max.x;
    }
    local_74 = local_78;
  }
  else {
    local_74 = local_60.Min.x;
  }
  if (local_60.Min.y <= local_68.y) {
    if (local_68.y <= local_60.Max.y) {
      local_84 = local_68.y;
    }
    else {
      local_84 = local_60.Max.y;
    }
    local_80 = local_84;
  }
  else {
    local_80 = local_60.Min.y;
  }
  ImVec2::ImVec2(&local_70,local_74,local_80);
  ImDrawList::AddRect((ImDrawList *)p1,(ImVec2 *)p2,in_stack_00000010,in_stack_0000000c,
                      in_stack_00000008,unaff_retaddr_00,unaff_retaddr);
  ImDrawList::AddLine(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,(ImVec2 *)p2_00,
                      (ImU32)in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
  return;
}

Assistant:

void ImGui::DebugLocateItemResolveWithLastItem()
{
    ImGuiContext& g = *GImGui;
    ImGuiLastItemData item_data = g.LastItemData;
    g.DebugLocateId = 0;
    ImDrawList* draw_list = GetForegroundDrawList(g.CurrentWindow);
    ImRect r = item_data.Rect;
    r.Expand(3.0f);
    ImVec2 p1 = g.IO.MousePos;
    ImVec2 p2 = ImVec2((p1.x < r.Min.x) ? r.Min.x : (p1.x > r.Max.x) ? r.Max.x : p1.x, (p1.y < r.Min.y) ? r.Min.y : (p1.y > r.Max.y) ? r.Max.y : p1.y);
    draw_list->AddRect(r.Min, r.Max, DEBUG_LOCATE_ITEM_COLOR);
    draw_list->AddLine(p1, p2, DEBUG_LOCATE_ITEM_COLOR);
}